

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

uint8_t * get_ls_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                             TileBufferDec (*tile_buffers) [64])

{
  int iVar1;
  _Bool _Var2;
  undefined8 *in_RCX;
  long in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int r_1;
  int c_2;
  int r;
  int is_last_1;
  int c_1;
  size_t tile_col_size;
  int is_last;
  int c;
  int tile_copy_mode;
  int tile_height;
  int tile_width;
  int tile_size_bytes;
  int tile_col_size_bytes;
  int tile_cols_end;
  int tile_cols_start;
  int single_col;
  int dec_tile_col;
  int tile_rows_end;
  int tile_rows_start;
  int single_row;
  int dec_tile_row;
  uint8_t *data_start;
  uint8_t *tile_col_data_end [64];
  size_t tile_size;
  uint8_t *raw_data_end;
  int have_tiles;
  int tile_rows;
  int tile_cols;
  AV1_COMMON *cm;
  int in_stack_fffffffffffffd24;
  uint8_t *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 in_stack_fffffffffffffd54;
  int iVar10;
  int local_2a4;
  uint in_stack_fffffffffffffd60;
  int local_29c;
  size_t in_stack_fffffffffffffd68;
  uint local_288;
  int local_280;
  int local_27c;
  undefined4 local_278;
  int local_274;
  int local_270;
  int local_26c;
  uint local_268;
  int local_264;
  int local_260;
  int local_25c;
  uint local_258;
  int local_254;
  uint8_t *local_250;
  long local_248 [5];
  uint8_t *local_40;
  uint8_t *local_10;
  
  iVar10 = *(int *)(in_RDI + 0x9c00);
  iVar1 = *(int *)(in_RDI + 0x9c04);
  if (iVar10 * iVar1 < 2) {
    *in_RCX = in_RSI;
    in_RCX[1] = in_RDX - (long)in_RSI;
    local_40 = (uint8_t *)0x0;
  }
  else {
    memset(local_248,0,0x200);
    iVar9 = iVar1;
    if (*(int *)(in_RDI + 0x58da0) < iVar1) {
      iVar9 = *(int *)(in_RDI + 0x58da0);
    }
    local_258 = (uint)(-1 < *(int *)(in_RDI + 0x58da0));
    if (local_258 == 0) {
      iVar8 = 0;
      iVar7 = iVar1;
    }
    else {
      iVar7 = iVar9 + 1;
      iVar8 = iVar9;
    }
    iVar6 = iVar10;
    if (*(int *)(in_RDI + 0x58da4) < iVar10) {
      iVar6 = *(int *)(in_RDI + 0x58da4);
    }
    local_268 = (uint)(-1 < *(int *)(in_RDI + 0x58da4));
    if (local_268 == 0) {
      iVar5 = 0;
      iVar4 = iVar10;
    }
    else {
      iVar4 = iVar6 + 1;
      iVar5 = iVar6;
    }
    local_274 = *(int *)(in_RDI + 0x58d9c);
    local_278 = *(undefined4 *)(in_RDI + 0x58d98);
    local_270 = iVar4;
    local_26c = iVar5;
    local_264 = iVar6;
    local_260 = iVar7;
    local_25c = iVar8;
    local_254 = iVar9;
    local_250 = in_RSI;
    _Var2 = av1_get_uniform_tile_size((AV1_COMMON *)(in_RDI + 0x3b60),&local_27c,&local_280);
    local_2a4 = in_stack_fffffffffffffd34;
    if (!_Var2) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                         "Not all the tiles in the tile list have the same size.");
      local_2a4 = in_stack_fffffffffffffd34;
    }
    iVar3 = local_280;
    if (local_280 < local_27c) {
      iVar3 = local_27c;
    }
    local_10 = in_RSI;
    for (local_288 = 0; (int)local_288 < iVar10; local_288 = local_288 + 1) {
      if (local_288 == iVar10 - 1U) {
        in_stack_fffffffffffffd68 = in_RDX - (long)local_10;
        local_248[(int)local_288] = in_RDX;
      }
      else {
        if (in_RDX - (long)local_10 < (long)local_274) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                             "Not enough data to read tile_col_size");
        }
        in_stack_fffffffffffffd68 =
             mem_get_varsize(in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
        local_10 = local_10 + local_274;
        if ((ulong)(in_RDX - (long)local_10) < in_stack_fffffffffffffd68) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                             "tile_col_data_end[%d] is out of bound",(ulong)local_288);
        }
        local_248[(int)local_288] = (long)(local_10 + in_stack_fffffffffffffd68);
      }
      local_10 = local_10 + in_stack_fffffffffffffd68;
    }
    local_10 = local_250;
    for (local_29c = local_26c; local_29c < local_270; local_29c = local_29c + 1) {
      in_stack_fffffffffffffd60 = (uint)(local_29c == iVar10 + -1);
      if (0 < local_29c) {
        local_10 = (uint8_t *)local_248[local_29c + -1];
      }
      if (in_stack_fffffffffffffd60 == 0) {
        local_10 = local_10 + local_274;
      }
      local_2a4 = 0;
      while( true ) {
        in_stack_fffffffffffffd30 = local_260;
        if (in_stack_fffffffffffffd60 != 0) {
          in_stack_fffffffffffffd30 = iVar1;
        }
        if (in_stack_fffffffffffffd30 <= local_2a4) break;
        get_ls_tile_buffer((uint8_t *)CONCAT44(in_stack_fffffffffffffd54,iVar9),
                           (aom_internal_error_info *)CONCAT44(iVar8,iVar7),
                           (uint8_t **)CONCAT44(iVar6,iVar5),
                           (TileBufferDec (*) [64])CONCAT44(iVar4,iVar3),local_2a4,
                           in_stack_fffffffffffffd30,in_stack_fffffffffffffd60,
                           (int)in_stack_fffffffffffffd68);
        local_2a4 = local_2a4 + 1;
      }
    }
    if (local_270 != iVar10) {
      local_10 = (uint8_t *)local_248[iVar10 + -2];
      for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
        get_ls_tile_buffer((uint8_t *)CONCAT44(iVar10,iVar9),
                           (aom_internal_error_info *)CONCAT44(iVar8,iVar7),
                           (uint8_t **)CONCAT44(iVar6,iVar5),
                           (TileBufferDec (*) [64])CONCAT44(iVar4,iVar3),local_2a4,
                           in_stack_fffffffffffffd30,in_stack_fffffffffffffd60,
                           (int)in_stack_fffffffffffffd68);
      }
    }
    local_40 = local_10;
  }
  return local_40;
}

Assistant:

static const uint8_t *get_ls_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS]) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int have_tiles = tile_cols * tile_rows > 1;
  const uint8_t *raw_data_end;  // The end of the last tile buffer

  if (!have_tiles) {
    const size_t tile_size = data_end - data;
    tile_buffers[0][0].data = data;
    tile_buffers[0][0].size = tile_size;
    raw_data_end = NULL;
  } else {
    // We locate only the tile buffers that are required, which are the ones
    // specified by pbi->dec_tile_col and pbi->dec_tile_row. Also, we always
    // need the last (bottom right) tile buffer, as we need to know where the
    // end of the compressed frame buffer is for proper superframe decoding.

    const uint8_t *tile_col_data_end[MAX_TILE_COLS] = { NULL };
    const uint8_t *const data_start = data;

    const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
    const int single_row = pbi->dec_tile_row >= 0;
    const int tile_rows_start = single_row ? dec_tile_row : 0;
    const int tile_rows_end = single_row ? tile_rows_start + 1 : tile_rows;
    const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
    const int single_col = pbi->dec_tile_col >= 0;
    const int tile_cols_start = single_col ? dec_tile_col : 0;
    const int tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;

    const int tile_col_size_bytes = pbi->tile_col_size_bytes;
    const int tile_size_bytes = pbi->tile_size_bytes;
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      aom_internal_error(
          &pbi->error, AOM_CODEC_CORRUPT_FRAME,
          "Not all the tiles in the tile list have the same size.");
    }
    const int tile_copy_mode =
        ((AOMMAX(tile_width, tile_height) << MI_SIZE_LOG2) <= 256) ? 1 : 0;
    // Read tile column sizes for all columns (we need the last tile buffer)
    for (int c = 0; c < tile_cols; ++c) {
      const int is_last = c == tile_cols - 1;
      size_t tile_col_size;

      if (!is_last) {
        if (tile_col_size_bytes > data_end - data) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "Not enough data to read tile_col_size");
        }
        tile_col_size = mem_get_varsize(data, tile_col_size_bytes);
        data += tile_col_size_bytes;
        if (tile_col_size > (size_t)(data_end - data)) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "tile_col_data_end[%d] is out of bound", c);
        }
        tile_col_data_end[c] = data + tile_col_size;
      } else {
        tile_col_size = data_end - data;
        tile_col_data_end[c] = data_end;
      }
      data += tile_col_size;
    }

    data = data_start;

    // Read the required tile sizes.
    for (int c = tile_cols_start; c < tile_cols_end; ++c) {
      const int is_last = c == tile_cols - 1;

      if (c > 0) data = tile_col_data_end[c - 1];

      if (!is_last) data += tile_col_size_bytes;

      // Get the whole of the last column, otherwise stop at the required tile.
      for (int r = 0; r < (is_last ? tile_rows : tile_rows_end); ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }

    // If we have not read the last column, then read it to get the last tile.
    if (tile_cols_end != tile_cols) {
      const int c = tile_cols - 1;

      data = tile_col_data_end[c - 1];

      for (int r = 0; r < tile_rows; ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }
    raw_data_end = data;
  }
  return raw_data_end;
}